

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int lws_strcmp_wildcard(char *wildcard,size_t wlen,char *check,size_t clen)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcStack_50;
  char *wc [3];
  char *pcStack_30;
  char *match [3];
  
  pcVar3 = wildcard + wlen;
  pcVar2 = check + clen;
  iVar1 = 0;
  do {
    if (wildcard == pcVar3) {
      if (iVar1 == 0) {
        return 1;
      }
      wildcard = wc[(long)iVar1 + -1];
      check = match[(long)iVar1 + -1];
      iVar1 = iVar1 + -1;
    }
    else if (*wildcard == '*') {
      wildcard = wildcard + 1;
      if (wildcard == pcVar3) {
        return 0;
      }
      if (iVar1 == 3) {
        _lws_log(1,"%s: exceeds * stack\n","lws_strcmp_wildcard");
        return 1;
      }
      wc[iVar1] = wildcard;
      match[iVar1] = check + 1;
      iVar1 = iVar1 + 1;
    }
    else if (*check == *wildcard) {
      wildcard = wildcard + 1;
      check = check + 1;
    }
    else {
      check = check + 1;
      if (iVar1 == 0) {
        return 1;
      }
    }
    if (pcVar2 <= check) {
      return (uint)(wildcard != pcVar3);
    }
  } while( true );
}

Assistant:

int
lws_strcmp_wildcard(const char *wildcard, size_t wlen, const char *check,
		    size_t clen)
{
	const char *match[3], *wc[3], *wc_end = wildcard + wlen,
		   *cend = check + clen;
	int sp = 0;

	do {

		if (wildcard == wc_end) {
			/*
			 * We reached the end of wildcard, but not of check,
			 * and the last thing in wildcard was not a * or we
			 * would have completed already... if we can rewind,
			 * let's try that...
			 */
			if (sp) {
				wildcard = wc[sp - 1];
				check = match[--sp];

				continue;
			}

			/* otherwise it's the end of the road for this one */

			return 1;
		}

		if (*wildcard == '*') {

			if (++wildcard == wc_end)
				 /*
				  * Wildcard ended on a *, so we know we will
				  * match unconditionally
				  */
				return 0;

			/*
			 * Now we need to stick wildcard here and see if there
			 * is any remaining match exists, for eg b of "a*b"
			 */

			if (sp == LWS_ARRAY_SIZE(match)) {
				lwsl_err("%s: exceeds * stack\n", __func__);
				return 1; /* we can't deal with it */
			}

			wc[sp] = wildcard;
			/* if we ever pop and come back here, pick up from +1 */
			match[sp++] = check + 1;
			continue;
		}

		if (*(check++) == *wildcard) {

			if (wildcard == wc_end)
				return 0;
			/*
			 * We're still compatible with wildcard... keep going
			 */
			wildcard++;

			continue;
		}

		if (!sp)
			/*
			 * We're just trying to match literals, and failed...
			 */
			return 1;

		/* we're looking for a post-* match... keep looking... */

	} while (check < cend);

	/*
	 * We reached the end of check, if also at end of wildcard we're OK
	 */

	return wildcard != wc_end;
}